

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O1

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::MessageFederateManager::getMessage(MessageFederateManager *this)

{
  long lVar1;
  long lVar2;
  long in_RSI;
  long lVar3;
  long lVar4;
  handle eptDat;
  undefined1 local_58 [24];
  unique_lock<std::shared_mutex> local_40;
  
  gmlc::libguarded::
  shared_guarded_opt<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
  ::lock((handle *)(local_58 + 0x10),
         (shared_guarded_opt<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
          *)(in_RSI + 0x178));
  lVar4 = *(long *)(local_58._16_8_ + 0x10);
  lVar1 = *(long *)(local_58._16_8_ + 0x30);
  if (lVar4 != lVar1) {
    lVar2 = *(long *)(local_58._16_8_ + 0x20);
    lVar3 = *(long *)(local_58._16_8_ + 0x28);
    do {
      if ((*(byte *)(lVar4 + 0x80) & 1) == 0) {
        gmlc::containers::
        SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>
        ::pop((SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>
               *)local_58);
        if (local_58[8] == '\x01') {
          (this->mLocalEndpoints).m_obj.dataStorage.csize = local_58._0_8_;
          goto LAB_00203889;
        }
      }
      lVar4 = lVar4 + 0xa8;
      if (lVar4 == lVar2) {
        lVar4 = *(long *)(lVar3 + 8);
        lVar3 = lVar3 + 8;
        lVar2 = lVar4 + 0x1f8;
      }
    } while (lVar4 != lVar1);
  }
  (this->mLocalEndpoints).m_obj.dataStorage.csize = 0;
LAB_00203889:
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_40);
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> MessageFederateManager::getMessage()
{
    // just start with the first endpoint and check until a queue isn't empty
    auto eptDat = eptData.lock();
    for (auto& edat : eptDat) {
        if (!edat.messages.empty()) {
            auto message = edat.messages.pop();
            if (message) {
                return std::move(*message);
            }
        }
    }
    return nullptr;
}